

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::val::ValidationState_t::GetDimension(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  Instruction *pIVar2;
  
  while( true ) {
    pIVar2 = FindDef(this,id);
    if (pIVar2 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x382,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const"
                   );
    }
    uVar1 = (pIVar2->inst_).opcode;
    if (uVar1 - 0x14 < 3) {
      return 1;
    }
    if (uVar1 - 0x17 < 2) {
      return (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[3];
    }
    if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) break;
    id = (pIVar2->inst_).type_id;
    if (id == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x399,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const"
                   );
    }
  }
  return 0;
}

Assistant:

uint32_t ValidationState_t::GetDimension(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return 1;

    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
      return inst->word(3);

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      // Actual dimension isn't known, return 0
      return 0;

    default:
      break;
  }

  if (inst->type_id()) return GetDimension(inst->type_id());

  assert(0);
  return 0;
}